

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_section_fixups.cpp
# Opt level: O1

void __thiscall
ExternalFixupMembersImport_Type_Test::TestBody(ExternalFixupMembersImport_Type_Test *this)

{
  database *db;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  char *pcVar1;
  pointer message;
  char *in_R9;
  pointer *__ptr;
  error_code eVar2;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  mock_mutex mutex;
  transaction<std::unique_lock<mock_mutex>_> transaction;
  string_mapping imported_names;
  undefined1 local_1e0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1d8;
  undefined1 local_1d0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0;
  error_code local_1b0;
  AssertHelper local_1a0;
  mutex_type local_191;
  not_null<pstore::transaction_base_*> local_190;
  undefined1 local_188 [8];
  bool local_180 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178 [4];
  error_code local_130;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_118;
  _Alloc_hider local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  transaction<std::unique_lock<mock_mutex>_> local_e0;
  string_mapping local_a8;
  
  db = &(this->super_ExternalFixupMembersImport).db_;
  local_188 = (undefined1  [8])&local_191;
  local_180[0] = false;
  std::unique_lock<mock_mutex>::lock((unique_lock<mock_mutex> *)local_188);
  local_180[0] = true;
  pstore::transaction<std::unique_lock<mock_mutex>_>::transaction
            (&local_e0,db,(unique_lock<mock_mutex> *)local_188);
  if ((local_180[0] == true) && (local_188 != (undefined1  [8])0x0)) {
    local_180[0] = false;
  }
  local_a8.strings_.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_a8.strings_;
  local_a8.adder_.views_.
  super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.adder_.views_.
  super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.adder_.views_.
  super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.strings_.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  local_a8.views_.
  super__List_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_a8.views_;
  local_a8.views_.
  super__List_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
  ._M_impl._M_node._M_size = 0;
  local_a8.lookup_._M_h._M_buckets = &local_a8.lookup_._M_h._M_single_bucket;
  local_a8.lookup_._M_h._M_bucket_count = 1;
  local_a8.lookup_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_a8.lookup_._M_h._M_element_count = 0;
  local_a8.lookup_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_a8.lookup_._M_h._M_rehash_policy._M_next_resize = 0;
  local_a8.lookup_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_190.ptr_ = &local_e0.super_transaction_base;
  local_a8.strings_.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       local_a8.strings_.
       super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  local_a8.views_.
  super__List_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       local_a8.views_.
       super__List_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  pstore::gsl::not_null<pstore::transaction_base_*>::ensure_invariant(&local_190);
  local_188 = (undefined1  [8])local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"name","");
  eVar2 = pstore::exchange::import_ns::string_mapping::add_string
                    (&local_a8,(not_null<transaction_base_*>)local_190.ptr_,(string *)local_188);
  local_1d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)eVar2._M_cat;
  local_1e0._0_4_ = eVar2._M_value;
  local_1b0._M_value = 0;
  local_1b0._M_cat = (error_category *)std::_V2::system_category();
  testing::internal::CmpHelperEQ<std::error_code,std::error_code>
            ((internal *)local_1d0,"imported_names.add_string (&transaction, \"name\")",
             "std::error_code{}",(error_code *)local_1e0,&local_1b0);
  if (local_188 != (undefined1  [8])local_178) {
    operator_delete((void *)local_188,local_178[0]._M_allocated_capacity + 1);
  }
  if (local_1d0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_188);
    if (local_1c8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_1c8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1e0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_section_fixups.cpp"
               ,0x1fb,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1e0,(Message *)local_188);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1e0);
    if (local_188 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_188 + 8))();
    }
    if (local_1c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_1c8,local_1c8);
    }
    goto LAB_00184aa0;
  }
  if (local_1c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1c8,local_1c8);
  }
  local_1d0 = (undefined1  [8])&local_1c0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1d0,"{ \"name\":0, \"offset\":19, \"addend\":23 }","");
  anon_unknown.dwarf_437d0d::ExternalFixupMembersImport::parse
            ((parser<pstore::exchange::import_ns::callbacks> *)local_188,(string *)local_1d0,db,
             &local_a8);
  if (local_1d0 != (undefined1  [8])&local_1c0) {
    operator_delete((void *)local_1d0,local_1c0._M_allocated_capacity + 1);
  }
  local_1e0[0] = local_130._M_value != 0;
  local_1d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_130._M_value == 0) {
    testing::Message::Message((Message *)&local_1b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(CONCAT44(local_1b0._4_4_,local_1b0._M_value) + 0x10),
               "Expected the parse to fail",0x1a);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1d0,(internal *)local_1e0,(AssertionResult *)"parser1.has_error ()",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_1a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_section_fixups.cpp"
               ,0x201,(char *)local_1d0);
    testing::internal::AssertHelper::operator=(&local_1a0,(Message *)&local_1b0);
    testing::internal::AssertHelper::~AssertHelper(&local_1a0);
    if (local_1d0 != (undefined1  [8])&local_1c0) {
      operator_delete((void *)local_1d0,local_1c0._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_1b0._4_4_,local_1b0._M_value) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_1b0._4_4_,local_1b0._M_value) + 8))();
    }
  }
  if (local_1d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1d8,local_1d8);
  }
  eVar2 = pstore::exchange::import_ns::make_error_code(xfixup_object_was_incomplete);
  local_1d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)eVar2._M_cat;
  local_1e0._0_4_ = eVar2._M_value;
  testing::internal::CmpHelperEQ<std::error_code,std::error_code>
            ((internal *)local_1d0,"parser1.last_error ()",
             "make_error_code (pstore::exchange::import_ns::error::xfixup_object_was_incomplete)",
             &local_130,(error_code *)local_1e0);
  if (local_1d0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1e0);
    if (local_1c8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_1c8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_section_fixups.cpp"
               ,0x204,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1b0,(Message *)local_1e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1b0);
    if ((long *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_) + 8))();
    }
  }
  if (local_1c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1c8,local_1c8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_p != &local_f8) {
    operator_delete(local_108._M_p,local_f8._M_allocated_capacity + 1);
  }
  if (local_118._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_118._M_pi);
  }
  std::
  deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
  ::~deque((deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
            *)local_180);
  if (local_188 != (undefined1  [8])0x0) {
    operator_delete((void *)local_188,0x68);
  }
  local_1d0 = (undefined1  [8])&local_1c0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1d0,"{ \"name\":0, \"type\":true, \"offset\":19, \"addend\":23 }","");
  anon_unknown.dwarf_437d0d::ExternalFixupMembersImport::parse
            ((parser<pstore::exchange::import_ns::callbacks> *)local_188,(string *)local_1d0,db,
             &local_a8);
  if (local_1d0 != (undefined1  [8])&local_1c0) {
    operator_delete((void *)local_1d0,local_1c0._M_allocated_capacity + 1);
  }
  local_1e0[0] = local_130._M_value != 0;
  local_1d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_130._M_value == 0) {
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_1d8;
    testing::Message::Message((Message *)&local_1b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(CONCAT44(local_1b0._4_4_,local_1b0._M_value) + 0x10),
               "Expected the parse to fail",0x1a);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1d0,(internal *)local_1e0,(AssertionResult *)"parser2.has_error ()",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_1a0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_section_fixups.cpp"
               ,0x20a,(char *)local_1d0);
    testing::internal::AssertHelper::operator=(&local_1a0,(Message *)&local_1b0);
    testing::internal::AssertHelper::~AssertHelper(&local_1a0);
    if (local_1d0 != (undefined1  [8])&local_1c0) {
      operator_delete((void *)local_1d0,local_1c0._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_1b0._4_4_,local_1b0._M_value) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_1b0._4_4_,local_1b0._M_value) + 8))();
    }
    local_1c8 = local_1d8;
    if (local_1d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_00184a4c;
  }
  else {
    eVar2 = pstore::exchange::import_ns::make_error_code(unexpected_boolean);
    local_1d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)eVar2._M_cat;
    local_1e0._0_4_ = eVar2._M_value;
    testing::internal::CmpHelperEQ<std::error_code,std::error_code>
              ((internal *)local_1d0,"parser2.last_error ()",
               "make_error_code (pstore::exchange::import_ns::error::unexpected_boolean)",&local_130
               ,(error_code *)local_1e0);
    if (local_1d0[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_1e0);
      if (local_1c8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = "";
      }
      else {
        message = (local_1c8->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_section_fixups.cpp"
                 ,0x20c,message);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1b0,(Message *)local_1e0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1b0);
      if ((long *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_) + 8))();
      }
    }
    if (local_1c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_1c8;
LAB_00184a4c:
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()(this_00,local_1c8);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_p != &local_f8) {
    operator_delete(local_108._M_p,local_f8._M_allocated_capacity + 1);
  }
  if (local_118._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_118._M_pi);
  }
  std::
  deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
  ::~deque((deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
            *)local_180);
  if (local_188 != (undefined1  [8])0x0) {
    operator_delete((void *)local_188,0x68);
  }
LAB_00184aa0:
  pstore::exchange::import_ns::string_mapping::~string_mapping(&local_a8);
  local_e0.super_transaction_base._vptr_transaction_base = (_func_int **)&PTR__transaction_0023bdb8;
  pstore::transaction_base::rollback(&local_e0.super_transaction_base);
  return;
}

Assistant:

TEST_F (ExternalFixupMembersImport, Type) {
    // Create matching names in the imported database.
    mock_mutex mutex;
    auto transaction = begin (db_, transaction_lock{mutex});

    pstore::exchange::import_ns::string_mapping imported_names;
    // Add a single name with index 0.
    ASSERT_EQ (imported_names.add_string (&transaction, "name"), std::error_code{});

    // The type key is missing altogether.
    {
        auto const & parser1 =
            this->parse (R"({ "name":0, "offset":19, "addend":23 })", &db_, imported_names);
        EXPECT_TRUE (parser1.has_error ()) << "Expected the parse to fail";
        EXPECT_EQ (
            parser1.last_error (),
            make_error_code (pstore::exchange::import_ns::error::xfixup_object_was_incomplete));
    }
    // The type key has the wrong type.
    {
        auto const & parser2 = this->parse (
            R"({ "name":0, "type":true, "offset":19, "addend":23 })", &db_, imported_names);
        ASSERT_TRUE (parser2.has_error ()) << "Expected the parse to fail";
        EXPECT_EQ (parser2.last_error (),
                   make_error_code (pstore::exchange::import_ns::error::unexpected_boolean));
    }
}